

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2.cpp
# Opt level: O2

int32_t utrie2_internalU8NextIndex_63(UTrie2 *trie,UChar32 c,uint8_t *src,uint8_t *limit)

{
  long lVar1;
  uint in_EAX;
  UChar32 c_00;
  int32_t iVar2;
  ulong uStack_18;
  int32_t i;
  
  uStack_18 = (ulong)in_EAX;
  lVar1 = 7;
  if ((long)limit - (long)src < 8) {
    lVar1 = (long)limit - (long)src;
  }
  c_00 = utf8_nextCharSafeBody_63(src,&i,(int32_t)lVar1,c,-1);
  iVar2 = u8Index(trie,c_00,i);
  return iVar2;
}

Assistant:

U_CAPI int32_t U_EXPORT2
utrie2_internalU8NextIndex(const UTrie2 *trie, UChar32 c,
                           const uint8_t *src, const uint8_t *limit) {
    int32_t i, length;
    i=0;
    /* support 64-bit pointers by avoiding cast of arbitrary difference */
    if((limit-src)<=7) {
        length=(int32_t)(limit-src);
    } else {
        length=7;
    }
    c=utf8_nextCharSafeBody(src, &i, length, c, -1);
    return u8Index(trie, c, i);
}